

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

uint32_t cache_numbits(io_buf *buf,int filepointer)

{
  bool bVar1;
  uint32_t uVar2;
  int extraout_var;
  undefined4 extraout_var_00;
  vw_exception *pvVar3;
  undefined1 *puVar4;
  undefined4 in_register_00000034;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  char temp;
  size_t v_length;
  version_struct v_tmp;
  vector<char,_std::allocator<char>_> t;
  uint32_t cache_numbits;
  char local_261;
  ulong local_260;
  undefined1 local_258 [4];
  undefined1 auStack_254 [4];
  int local_250 [2];
  vector<char,_std::allocator<char>_> local_248;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  uint32_t local_1b0 [4];
  ostream local_1a0;
  
  (*buf->_vptr_io_buf[5])(buf,CONCAT44(in_register_00000034,filepointer),&local_260,8);
  if (0x3d < local_260) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a0,"cache version too long, cache file is probably invalid",0x36);
    pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
               ,0x59,&local_1d0);
    __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (local_260 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a0,"cache version too short, cache file is probably invalid",0x37);
    pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
               ,0x5c,&local_1f0);
    __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::vector<char,_std::allocator<char>_>::vector(&local_248,local_260,(allocator_type *)local_1b0)
  ;
  (*buf->_vptr_io_buf[5])
            (buf,filepointer,
             local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,local_260);
  puVar4 = auStack_254;
  __isoc99_sscanf(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,"%d.%d.%d",local_258,puVar4,local_250);
  iVar6 = -(uint)((int)_local_258 == version.major);
  iVar7 = -(uint)((int)((ulong)_local_258 >> 0x20) == version.minor);
  auVar5._4_4_ = iVar6;
  auVar5._0_4_ = iVar6;
  auVar5._8_4_ = iVar7;
  auVar5._12_4_ = iVar7;
  iVar6 = movmskpd((int)puVar4,auVar5);
  bVar1 = version.rev == local_250[0];
  if (bVar1 && iVar6 == 3) {
    iVar7 = (*buf->_vptr_io_buf[5])(buf,filepointer,&local_261,1);
    if (CONCAT44(extraout_var,iVar7) == 0 || extraout_var < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,"failed to read",0xe);
      pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x69,&local_210);
      __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (local_261 != 'c') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a0,"data file is not a cache file",0x1d);
      pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x6c,&local_230);
      __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  if (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar2 = 0;
  if (bVar1 && iVar6 == 3) {
    iVar6 = (*buf->_vptr_io_buf[5])(buf,filepointer,local_1b0,4);
    uVar2 = 1;
    if (3 < CONCAT44(extraout_var_00,iVar6)) {
      uVar2 = local_1b0[0];
    }
  }
  return uVar2;
}

Assistant:

uint32_t cache_numbits(io_buf* buf, int filepointer)
{
  try
  {
    size_t v_length;
    buf->read_file(filepointer, (char*)&v_length, sizeof(v_length));
    if (v_length > 61)
      THROW("cache version too long, cache file is probably invalid");

    if (v_length == 0)
      THROW("cache version too short, cache file is probably invalid");

    std::vector<char> t(v_length);
    buf->read_file(filepointer, t.data(), v_length);
    version_struct v_tmp(t.data());
    if (v_tmp != version)
    {
      //      cout << "cache has possibly incompatible version, rebuilding" << endl;
      return 0;
    }

    char temp;
    if (buf->read_file(filepointer, &temp, 1) < 1)
      THROW("failed to read");

    if (temp != 'c')
      THROW("data file is not a cache file");
  }
  catch (...)
  {
    // TODO fix this exception bubbling behavior: https://github.com/VowpalWabbit/vowpal_wabbit/issues/1774
    // Prior to using a std::vector, a v_array was used and the catch statement was used to delete it.
    // This caused any exception to be ignored. Bubbling up this exception causes tests to fail so
    // I am going to swallow it to maintain previous behavior.
  }

  uint32_t cache_numbits;
  if (buf->read_file(filepointer, &cache_numbits, sizeof(cache_numbits)) < (int)sizeof(cache_numbits))
  {
    return true;
  }

  return cache_numbits;
}